

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void * xmlXzfileOpen(char *filename)

{
  void *pvVar1;
  char *filename_00;
  
  pvVar1 = xmlXzfileOpen_real(filename);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
    filename_00 = xmlURIUnescapeString(filename,0,(char *)0x0);
    if (filename_00 != (char *)0x0) {
      pvVar1 = xmlXzfileOpen_real(filename_00);
    }
    (*xmlFree)(filename_00);
  }
  return pvVar1;
}

Assistant:

static void *
xmlXzfileOpen (const char *filename) {
    char *unescaped;
    void *retval;

    retval = xmlXzfileOpen_real(filename);
    if (retval == NULL) {
	unescaped = xmlURIUnescapeString(filename, 0, NULL);
	if (unescaped != NULL) {
	    retval = xmlXzfileOpen_real(unescaped);
	}
	xmlFree(unescaped);
    }

    return retval;
}